

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_DamageChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *source;
  AActor *inflictor;
  AActor *dmgtarget;
  AActor *pAVar4;
  AActor *origin;
  int selector_00;
  char *pcVar5;
  PClassActor *filter;
  bool bVar6;
  int local_60;
  int local_5c;
  int local_58;
  FName local_50;
  FName local_4c;
  TThinkerIterator<AActor> it;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e0072;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e0043:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0072:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1725,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003dfe0d;
    pPVar3 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e0072;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e0043;
LAB_003dfe0d:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003e009a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1726,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e009a;
  }
  iVar2 = param[1].field_0.i;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e0128;
    }
    local_58 = param[2].field_0.i;
LAB_003dfe6c:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0147:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1728,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_5c = param[3].field_0.i;
LAB_003dfe7f:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003e004c:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e0053:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1729,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e004c;
      filter = (PClassActor *)0x0;
    }
LAB_003dfea1:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e00f7:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x172a,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = param[5].field_0.i;
LAB_003dfeb4:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e00d8:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x172b,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003e0128:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1727,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003dfe6c;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0147;
    }
    local_5c = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003dfe7f;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[4].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e0053;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003dfea1;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e00f7;
    }
    local_60 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003dfeb4;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e00d8;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e00b9;
      }
      goto LAB_003dfece;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e00b9:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x172c,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003dfece:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(origin,selector_00);
  inflictor = COPY_AAPTR(origin,selector);
  FThinkerIterator::FThinkerIterator
            (&it.super_FThinkerIterator,AActor::RegistrationInfo.MyClass,0x80);
  dmgtarget = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
  if (dmgtarget != (AActor *)0x0) {
    do {
      pAVar4 = (dmgtarget->master).field_0.p;
      if (pAVar4 == (AActor *)0x0) {
LAB_003dff3c:
        pAVar4 = (AActor *)0x0;
      }
      else if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (dmgtarget->master).field_0.p = (AActor *)0x0;
        goto LAB_003dff3c;
      }
      if (pAVar4 == origin) {
        local_4c.Index = local_58;
        local_50.Index = local_60;
        DoDamage(dmgtarget,inflictor,source,iVar2,&local_4c,local_5c,filter,&local_50);
      }
      dmgtarget = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
    } while (dmgtarget != (AActor *)0x0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self)
			DoDamage(mo, inflictor, source, amount, damagetype, flags, filter, species);
	}
	return 0;
}